

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::codepointList(GrpParser *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp137_AST;
  RefAST tmp136_AST;
  RefAST tmp135_AST;
  RefAST codepointList_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffed0;
  BitSet *in_stack_fffffffffffffed8;
  ASTPair *in_stack_fffffffffffffee0;
  RefCount<Token> *this_00;
  RefCount<AST> *in_stack_fffffffffffffee8;
  RefCount<AST> *in_stack_fffffffffffffef0;
  RefToken *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  ASTPair *in_stack_ffffffffffffff18;
  ASTPair *currentAST_00;
  ASTFactory *in_stack_ffffffffffffff20;
  ASTFactory *this_01;
  RefToken *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar4;
  undefined1 local_a8 [8];
  GrpParser *in_stack_ffffffffffffff60;
  undefined1 local_98 [39];
  undefined1 local_71;
  undefined1 local_70 [8];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ASTPair::ASTPair(in_stack_fffffffffffffee0);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffee0->root,(RefCount<AST> *)in_stack_fffffffffffffed8);
  uVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  switch(uVar2) {
  case 6:
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffee0->root,(RefCount<AST> *)in_stack_fffffffffffffed8);
    this_01 = (ASTFactory *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff00);
    RefCount<AST>::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
    Parser::match((Parser *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  in_stack_ffffffffffffff0c);
    codepointItem(in_stack_ffffffffffffff60);
    currentAST_00 = (ASTPair *)(in_RDI + 6);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffee0->root,(RefCount<AST> *)in_stack_fffffffffffffed8);
    ASTFactory::addASTChild
              (this_01,currentAST_00,
               (RefAST *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    while( true ) {
      uVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      bVar1 = BitSet::member(in_stack_fffffffffffffed8,
                             (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      in_stack_ffffffffffffff10 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff10);
      if (!bVar1) break;
      in_stack_ffffffffffffff0c = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      in_stack_ffffffffffffff00 = (RefToken *)(ulong)(in_stack_ffffffffffffff0c - 0x11);
      switch(in_stack_ffffffffffffff00) {
      case (RefToken *)0x0:
      case (RefToken *)0x3:
      case (RefToken *)0x10:
        break;
      default:
        local_71 = 1;
        uVar3 = __cxa_allocate_exception(0x40);
        (**(code **)(*in_RDI + 0x28))(local_70,in_RDI,1);
        NoViableAltException::NoViableAltException
                  ((NoViableAltException *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
        local_71 = 0;
        __cxa_throw(uVar3,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      case (RefToken *)0x4:
        RefCount<AST>::RefCount
                  (&in_stack_fffffffffffffee0->root,(RefCount<AST> *)in_stack_fffffffffffffed8);
        (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
        ASTFactory::create((ASTFactory *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff00);
        RefCount<AST>::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
        RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
        Parser::match((Parser *)CONCAT44(uVar2,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c)
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      }
      codepointItem(in_stack_ffffffffffffff60);
      in_stack_fffffffffffffee8 = (RefCount<AST> *)(in_RDI + 6);
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffee0->root,(RefCount<AST> *)in_stack_fffffffffffffed8);
      ASTFactory::addASTChild
                (this_01,currentAST_00,(RefAST *)CONCAT44(uVar2,in_stack_ffffffffffffff10));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    }
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffee0->root,(RefCount<AST> *)in_stack_fffffffffffffed8);
    this_00 = (RefCount<Token> *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_98,in_RDI,1);
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff00);
    RefCount<AST>::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<Token>::~RefCount(this_00);
    Parser::match((Parser *)CONCAT44(uVar2,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    break;
  default:
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_a8,in_RDI,1);
    NoViableAltException::NoViableAltException
              ((NoViableAltException *)CONCAT17(uVar4,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  case 0x11:
  case 0x14:
  case 0x21:
    codepointItem(in_stack_ffffffffffffff60);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,(RefCount<AST> *)(in_RDI + 6));
    ASTFactory::addASTChild
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (RefAST *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  }
  RefCount<AST>::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  RefCount<AST>::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void GrpParser::codepointList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST codepointList_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case OP_LPAREN:
		{
			{
			RefAST tmp135_AST = nullAST;
			tmp135_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			codepointItem();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((_tokenSet_36.member(LA(1)))) {
					{
					switch ( LA(1)) {
					case OP_COMMA:
					{
						RefAST tmp136_AST = nullAST;
						tmp136_AST = astFactory.create(LT(1));
						match(OP_COMMA);
						break;
					}
					case LIT_INT:
					case LIT_STRING:
					case LIT_CHAR:
					{
						break;
					}
					default:
					{
						throw NoViableAltException(LT(1));
					}
					}
					}
					codepointItem();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop101;
				}
				
			} while (true);
			_loop101:;
			}
			RefAST tmp137_AST = nullAST;
			tmp137_AST = astFactory.create(LT(1));
			match(OP_RPAREN);
			}
			break;
		}
		case LIT_INT:
		case LIT_STRING:
		case LIT_CHAR:
		{
			codepointItem();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		codepointList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_37);
	}
	returnAST = codepointList_AST;
}